

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitStringTest_random_Test<signed_char>::TestBody(SplitStringTest_random_Test<signed_char> *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  split_result;
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  data;
  long *local_a8;
  AssertHelper local_a0 [8];
  internal local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  container_type_conflict1 local_88;
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_70;
  
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::RandomTestData(&local_70,'\0',0,0);
  jessilib::
  split<std::vector,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_signed_char>
            (&local_88,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )local_70.m_str._M_dataplus._M_p,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )(local_70.m_str._M_dataplus._M_p + local_70.m_str._M_string_length),'\0');
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::allocator<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>,std::vector<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::allocator<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>>
            (local_98,"split_result","data.m_tokens",&local_88,&local_70.m_tokens);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xe2,pcVar1);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_70.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_70.m_str._M_dataplus._M_p != &local_70.m_str.field_2) {
    operator_delete(local_70.m_str._M_dataplus._M_p,local_70.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_70.m_delim._M_dataplus._M_p != &local_70.m_delim.field_2) {
    operator_delete(local_70.m_delim._M_dataplus._M_p,
                    local_70.m_delim.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random) {
	RandomTestData<TypeParam> data{};
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}